

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MinefieldDataFilter.h
# Opt level: O1

void __thiscall
KDIS::PDU::Minefield_Data_PDU::SetDataFilter(Minefield_Data_PDU *this,MinefieldDataFilter *DF)

{
  (this->m_DataFilter).m_FilterUnion = DF->m_FilterUnion;
  return;
}

Assistant:

class KDIS_EXPORT MinefieldDataFilter : public DataTypeBase
{
protected:

    union
    {
        struct
        {
            KUINT32 m_ui32GroundOffset : 1;
            KUINT32 m_ui32WaterOffset  : 1;
            KUINT32 m_ui32SnowOffset   : 1;
            KUINT32 m_ui32MineOri      : 1;
            KUINT32 m_ui32ThermalCon   : 1;
            KUINT32 m_ui32Reflectance  : 1;
            KUINT32 m_ui32MineEmpAge   : 1;
            KUINT32 m_ui32TripDetWire  : 1;
            KUINT32 m_ui32Fusing       : 1;
            KUINT32 m_ui32ScalarDet    : 1;
            KUINT32 m_ui32PaintScm     : 1;
            KUINT32 m_ui32Padding      : 21;
        };
        KUINT32 m_ui32Filter;
    } m_FilterUnion;

public:

    static const KUINT16 MINEFIELD_DATA_FILTER_SIZE = 4;

    MinefieldDataFilter();

    MinefieldDataFilter(KDataStream &stream) noexcept(false);

    MinefieldDataFilter( KBOOL GroundBurialDepthOffset, KBOOL WaterBurialDepthOffset, KBOOL SnowBurialDepthOffset,
                         KBOOL MineOrientation, KBOOL ThermalContrast, KBOOL Reflectance, KBOOL MineEmplacementAge,
                         KBOOL TripDetonationWire, KBOOL Fusing, KBOOL ScalarDetectionCoefficient, KBOOL PaintScheme );

    virtual ~MinefieldDataFilter();

    //************************************
    // FullName:    KDIS::DATA_TYPE::MinefieldDataFilter::SetGroundBurialDepthOffset
    //              KDIS::DATA_TYPE::MinefieldDataFilter::IsGroundBurialDepthOffset
    // Description: Identifies whether Ground Burial Depth Offset data is requested / present.
    //              true(1) - requested, false(0) - not requested.
    // Parameter:   KBOOL B, void
    //************************************
    void SetGroundBurialDepthOffset( KBOOL B );
    KBOOL IsGroundBurialDepthOffset() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::MinefieldDataFilter::SetWaterBurialDepthOffset
    //              KDIS::DATA_TYPE::MinefieldDataFilter::IsWaterBurialDepthOffset
    // Description: Identifies whether Water Burial Depth Offset data is requested / present.
    //              true(1) - requested, false(0) - not requested.
    // Parameter:   KBOOL B, void
    //************************************
    void SetWaterBurialDepthOffset( KBOOL B );
    KBOOL IsWaterBurialDepthOffset() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::MinefieldDataFilter::SetSnowBurialDepthOffset
    //              KDIS::DATA_TYPE::MinefieldDataFilter::IsSnowBurialDepthOffset
    // Description: Identifies whether Snow Burial Depth Offset data is requested / present.
    //              true(1) - requested, false(0) - not requested.
    // Parameter:   KBOOL B, void
    //************************************
    void SetSnowBurialDepthOffset( KBOOL B );
    KBOOL IsSnowBurialDepthOffset() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::MinefieldDataFilter::SetMineOrientation
    //              KDIS::DATA_TYPE::MinefieldDataFilter::IsMineOrientation
    // Description: Identifies whether Mine Orientation data is requested / present.
    //              true(1) - requested, false(0) - not requested.
    // Parameter:   KBOOL B, void
    //************************************
    void SetMineOrientation( KBOOL B );
    KBOOL IsMineOrientation() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::MinefieldDataFilter::SetThermalContrast
    //              KDIS::DATA_TYPE::MinefieldDataFilter::IsThermalContrast
    // Description: Identifies whether Thermal Contrast data is requested / present.
    //              true(1) - requested, false(0) - not requested.
    // Parameter:   KBOOL B, void
    //************************************
    void SetThermalContrast( KBOOL B );
    KBOOL IsThermalContrast() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::MinefieldDataFilter::SetReflectance
    //              KDIS::DATA_TYPE::MinefieldDataFilter::IsReflectance
    // Description: Identifies whether Dielectric Constant data is requested / present.
    //              true(1) - requested, false(0) - not requested.
    // Parameter:   KBOOL B, void
    //************************************
    void SetReflectance( KBOOL B );
    KBOOL IsReflectance() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::MinefieldDataFilter::SetMineEmplacementAge
    //              KDIS::DATA_TYPE::MinefieldDataFilter::IsMineEmplacementAge
    // Description: Identifies whether Mine Emplacement Age data is requested / present.
    //              true(1) - requested, false(0) - not requested.
    // Parameter:   KBOOL B, void
    //************************************
    void SetMineEmplacementAge( KBOOL B );
    KBOOL IsMineEmplacementAge() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::MinefieldDataFilter::SetTripDetonationWire
    //              KDIS::DATA_TYPE::MinefieldDataFilter::IsTripDetonationWire
    // Description: Identifies whether Trip / Detonation Wire Location data is requested / present.
    //              true(1) - requested, false(0) - not requested.
    // Parameter:   KBOOL B, void
    //************************************
    void SetTripDetonationWire( KBOOL B );
    KBOOL IsTripDetonationWire() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::MinefieldDataFilter::SetFusing
    //              KDIS::DATA_TYPE::MinefieldDataFilter::IsFusing
    // Description: Identifies whether Fusing data is requested / present.
    //              true(1) - requested, false(0) - not requested.
    // Parameter:   KBOOL B, void
    //************************************
    void SetFusing( KBOOL B );
    KBOOL IsFusing() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::MinefieldDataFilter::SetScalarDetectionCoefficient
    //              KDIS::DATA_TYPE::MinefieldDataFilter::IsScalarDetectionCoefficient
    // Description: Identifies whether Scalar Detection Coefficient data is requested / present.
    //              true(1) - requested, false(0) - not requested.
    // Parameter:   KBOOL B, void
    //************************************
    void SetScalarDetectionCoefficient( KBOOL B );
    KBOOL IsScalarDetectionCoefficient() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::MinefieldDataFilter::SetPaintScheme
    //              KDIS::DATA_TYPE::MinefieldDataFilter::IsPaintScheme
    // Description: Identifies whether Paint Scheme data is requested / present.
    //              true(1) - requested, false(0) - not requested.
    // Parameter:   KBOOL B, void
    //************************************
    void SetPaintScheme( KBOOL B );
    KBOOL IsPaintScheme() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::MinefieldDataFilter::GetAsString
    // Description: Returns a string representation.
    //************************************
    virtual KString GetAsString() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::MinefieldDataFilter::Decode
    // Description: Convert From Network Data.
    // Parameter:   KDataStream & stream
    //************************************
    virtual void Decode(KDataStream &stream) noexcept(false);

    //************************************
    // FullName:    KDIS::DATA_TYPE::MinefieldDataFilter::Encode
    // Description: Convert To Network Data.
    // Parameter:   KDataStream & stream
    //************************************
    virtual KDataStream Encode() const;
    virtual void Encode( KDataStream & stream ) const;

    KBOOL operator == ( const MinefieldDataFilter & Value ) const;
    KBOOL operator != ( const MinefieldDataFilter & Value ) const;
}